

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidGeometry(ON_Brep *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  ON_Curve **ppOVar11;
  ON_Surface **ppOVar12;
  ON_BrepVertex *pOVar13;
  ON_BrepEdge *pOVar14;
  ON_BrepFace *pOVar15;
  ON_BrepTrim *pOVar16;
  ON_BrepLoop *pOVar17;
  int dim;
  int c3_dim;
  int c2_dim;
  int li;
  int ti;
  int fi;
  int ei;
  int vi;
  int si;
  int c3i;
  int c2i;
  int face_count;
  int loop_count;
  int trim_count;
  int edge_count;
  int vertex_count;
  int surface_count;
  int curve3d_count;
  int curve2d_count;
  ON_TextLog *text_log_local;
  ON_Brep *this_local;
  
  iVar2 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  iVar3 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  iVar4 = ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  iVar5 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
  iVar6 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
  iVar7 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T);
  iVar8 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
  iVar9 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  for (si = 0; si < iVar2; si = si + 1) {
    ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                         (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,si);
    if (*ppOVar11 != (ON_Curve *)0x0) {
      ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                           (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,si);
      uVar10 = (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                         (*ppOVar11,text_log);
      if ((uVar10 & 1) == 0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_C2[%d] is invalid.\n",(ulong)(uint)si);
        }
        return false;
      }
      ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                           (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,si);
      uVar10 = (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (uVar10 != 2) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n",
                            (ulong)(uint)si,(ulong)uVar10);
        }
        return false;
      }
    }
  }
  for (vi = 0; vi < iVar3; vi = vi + 1) {
    ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                         (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,vi);
    if (*ppOVar11 != (ON_Curve *)0x0) {
      ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                           (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,vi);
      uVar10 = (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                         (*ppOVar11,text_log);
      if ((uVar10 & 1) == 0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_C3[%d] is invalid.\n",(ulong)(uint)vi);
        }
        return false;
      }
      ppOVar11 = ON_SimpleArray<ON_Curve_*>::operator[]
                           (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,vi);
      uVar10 = (*((*ppOVar11)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (uVar10 != 3) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_C3[%d]->Dimension() = %d (should be 3).\n",
                            (ulong)(uint)vi,(ulong)uVar10);
        }
        return false;
      }
    }
  }
  ei = 0;
  do {
    if (iVar4 <= ei) {
      fi = 0;
      while( true ) {
        if (iVar5 <= fi) {
          ti = 0;
          while( true ) {
            if (iVar6 <= ti) {
              li = 0;
              while( true ) {
                if (iVar9 <= li) {
                  c2_dim = 0;
                  while( true ) {
                    if (iVar7 <= c2_dim) {
                      c3_dim = 0;
                      while( true ) {
                        if (iVar8 <= c3_dim) {
                          return true;
                        }
                        pOVar17 = ON_ClassArray<ON_BrepLoop>::operator[]
                                            ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,c3_dim);
                        if ((pOVar17->m_loop_index != -1) &&
                           (bVar1 = IsValidLoopGeometry(this,c3_dim,text_log), !bVar1)) break;
                        c3_dim = c3_dim + 1;
                      }
                      if (text_log != (ON_TextLog *)0x0) {
                        ON_TextLog::Print(text_log,"ON_Brep.m_L[%d] is invalid.\n",
                                          (ulong)(uint)c3_dim);
                      }
                      return false;
                    }
                    pOVar16 = ON_ClassArray<ON_BrepTrim>::operator[]
                                        ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,c2_dim);
                    if ((pOVar16->m_trim_index != -1) &&
                       (bVar1 = IsValidTrimGeometry(this,c2_dim,text_log), !bVar1)) break;
                    c2_dim = c2_dim + 1;
                  }
                  if (text_log != (ON_TextLog *)0x0) {
                    ON_TextLog::Print(text_log,"ON_Brep.m_T[%d] is invalid.\n",(ulong)(uint)c2_dim);
                  }
                  return false;
                }
                pOVar15 = ON_ClassArray<ON_BrepFace>::operator[]
                                    ((ON_ClassArray<ON_BrepFace> *)&this->m_F,li);
                if ((pOVar15->m_face_index != -1) &&
                   (bVar1 = IsValidFaceGeometry(this,li,text_log), !bVar1)) break;
                li = li + 1;
              }
              if (text_log != (ON_TextLog *)0x0) {
                ON_TextLog::Print(text_log,"ON_Brep.m_F[%d] is invalid.\n",(ulong)(uint)li);
              }
              return false;
            }
            pOVar14 = ON_ClassArray<ON_BrepEdge>::operator[]
                                ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,ti);
            if ((pOVar14->m_edge_index != -1) &&
               (bVar1 = IsValidEdgeGeometry(this,ti,text_log), !bVar1)) break;
            ti = ti + 1;
          }
          if (text_log != (ON_TextLog *)0x0) {
            ON_TextLog::Print(text_log,"ON_Brep.m_E[%d] is invalid.\n",(ulong)(uint)ti);
          }
          return false;
        }
        pOVar13 = ON_ClassArray<ON_BrepVertex>::operator[]
                            ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,fi);
        if ((pOVar13->m_vertex_index != -1) &&
           (bVar1 = IsValidVertexGeometry(this,fi,text_log), !bVar1)) break;
        fi = fi + 1;
      }
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"ON_Brep.m_V[%d] is invalid.\n",(ulong)(uint)fi);
      }
      return false;
    }
    ppOVar12 = ON_SimpleArray<ON_Surface_*>::operator[]
                         (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,ei);
    if (*ppOVar12 != (ON_Surface *)0x0) {
      ppOVar12 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,ei);
      uVar10 = (*((*ppOVar12)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])
                         (*ppOVar12,text_log);
      if ((uVar10 & 1) == 0) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_S[%d] is invalid.\n",(ulong)(uint)ei);
        }
        return false;
      }
      ppOVar12 = ON_SimpleArray<ON_Surface_*>::operator[]
                           (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,ei);
      uVar10 = (*((*ppOVar12)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])();
      if (uVar10 != 3) {
        if (text_log != (ON_TextLog *)0x0) {
          ON_TextLog::Print(text_log,"ON_Brep.m_S[%d]->Dimension() = %d (should be 3).\n",
                            (ulong)(uint)ei,(ulong)uVar10);
        }
        return false;
      }
    }
    ei = ei + 1;
  } while( true );
}

Assistant:

bool
ON_Brep::IsValidGeometry( ON_TextLog* text_log ) const
{
  const int curve2d_count = m_C2.Count();
  const int curve3d_count = m_C3.Count();
  const int surface_count = m_S.Count();
  const int vertex_count  = m_V.Count();
  const int edge_count    = m_E.Count();
  const int trim_count    = m_T.Count();
  const int loop_count    = m_L.Count();
  const int face_count    = m_F.Count();

  int c2i, c3i, si, vi, ei, fi, ti, li;

  // check 2d curve geometry
  for ( c2i = 0; c2i < curve2d_count; c2i++ ) {
    if ( !m_C2[c2i] )
    {
      continue;
      // nullptr 2d curves are ok if they are not referenced
    }
    if ( !m_C2[c2i]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C2[%d] is invalid.\n",c2i);
      return false;
    }
    int c2_dim = m_C2[c2i]->Dimension();
    if ( c2_dim != 2 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C2[%d]->Dimension() = %d (should be 2).\n", c2i, c2_dim );
      return false;
    }
  }

  // check 3d curve geometry
  for ( c3i = 0; c3i < curve3d_count; c3i++ ) {
    if ( !m_C3[c3i] )
    {
      continue;
      // nullptr 3d curves are ok if they are not referenced
    }
    if ( !m_C3[c3i]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C3[%d] is invalid.\n",c3i);
      return false;
    }
    int c3_dim = m_C3[c3i]->Dimension();
    if ( c3_dim != 3 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_C3[%d]->Dimension() = %d (should be 3).\n", c3i, c3_dim );
      return false;
    }
  }

  // check 3d surface geometry
  for ( si = 0; si < surface_count; si++ ) {
    if ( !m_S[si] )
    {
      continue;
      // nullptr 3d surfaces are ok if they are not referenced
    }
    if ( !m_S[si]->IsValid(text_log) )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_S[%d] is invalid.\n",si);
      return false;
    }
    int dim = m_S[si]->Dimension();
    if ( dim != 3 )
    {
      if ( text_log )
        text_log->Print("ON_Brep.m_S[%d]->Dimension() = %d (should be 3).\n", si, dim );
      return false;
    }
  }

  // check vertices
  for ( vi = 0; vi < vertex_count; vi++ ) {
    if ( m_V[vi].m_vertex_index == -1 )
      continue;
    if ( !IsValidVertexGeometry( vi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_V[%d] is invalid.\n",vi);
      return false;
    }
  }

  // check edges
  for ( ei = 0; ei < edge_count; ei++ ) 
  {
    if ( m_E[ei].m_edge_index == -1 )
      continue;
    if ( !IsValidEdgeGeometry( ei, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_E[%d] is invalid.\n",ei);
      return false;
    }
  }

  // check faces
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    if ( m_F[fi].m_face_index == -1 )
      continue;
    if ( !IsValidFaceGeometry( fi, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_F[%d] is invalid.\n",fi);
      return false;
    }
  }

  // check trims
  for ( ti = 0; ti < trim_count; ti++ )
  {
    if ( m_T[ti].m_trim_index == -1 )
      continue;
    if ( !IsValidTrimGeometry( ti, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_T[%d] is invalid.\n",ti);
      return false;
    }
  }

  // check loops
  for ( li = 0; li < loop_count; li++ )
  {
    if ( m_L[li].m_loop_index == -1 )
      continue;
    if ( !IsValidLoopGeometry( li, text_log ) ) {
      if ( text_log )
        text_log->Print("ON_Brep.m_L[%d] is invalid.\n",li);
      return false;
    }
  }

  return true;
}